

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_write_ready(void)

{
  int iVar1;
  uv_os_sock_t sock;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    sock = create_tcp_socket();
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&client);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_tcp_open(&client,sock);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&addr,connect1_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          puVar2 = uv_default_loop();
          uv_run(puVar2,UV_RUN_DEFAULT);
          eval_a = 1;
          eval_b = (int64_t)shutdown_cb_called;
          if (eval_b == 1) {
            eval_a = 1;
            eval_b = (int64_t)shutdown_requested;
            if (eval_b == 1) {
              eval_a = 1;
              eval_b = (int64_t)connect_cb_called;
              if (eval_b == 1) {
                eval_a = (int64_t)write_cb_called;
                eval_b = 0;
                if (eval_a < 1) {
                  pcVar5 = ">";
                  pcVar6 = "0";
                  pcVar4 = "write_cb_called";
                  uVar3 = 0x192;
                }
                else {
                  eval_a = 1;
                  eval_b = (int64_t)close_cb_called;
                  if (eval_b == 1) {
                    puVar2 = uv_default_loop();
                    close_loop(puVar2);
                    eval_a = 0;
                    puVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(puVar2);
                    eval_b = (int64_t)iVar1;
                    if (eval_b == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar5 = "==";
                    pcVar6 = "uv_loop_close(uv_default_loop())";
                    pcVar4 = "0";
                    uVar3 = 0x195;
                  }
                  else {
                    pcVar5 = "==";
                    pcVar6 = "close_cb_called";
                    pcVar4 = "1";
                    uVar3 = 0x193;
                  }
                }
              }
              else {
                pcVar5 = "==";
                pcVar6 = "connect_cb_called";
                pcVar4 = "1";
                uVar3 = 0x191;
              }
            }
            else {
              pcVar5 = "==";
              pcVar6 = "shutdown_requested";
              pcVar4 = "1";
              uVar3 = 400;
            }
          }
          else {
            pcVar5 = "==";
            pcVar6 = "shutdown_cb_called";
            pcVar4 = "1";
            uVar3 = 399;
          }
        }
        else {
          pcVar5 = "==";
          pcVar6 = "0";
          pcVar4 = "r";
          uVar3 = 0x18b;
        }
      }
      else {
        pcVar5 = "==";
        pcVar6 = "0";
        pcVar4 = "r";
        uVar3 = 0x185;
      }
    }
    else {
      pcVar5 = "==";
      pcVar6 = "0";
      pcVar4 = "r";
      uVar3 = 0x182;
    }
  }
  else {
    pcVar5 = "==";
    pcVar6 = "0";
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar3 = 0x17c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_write_ready) {
  struct sockaddr_in addr;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect1_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, shutdown_requested);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_GT(write_cb_called, 0);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}